

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::TcpSocket::update(TcpSocket *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uchar *buf;
  
  iVar2 = (*this->_vptr_TcpSocket[8])();
  bVar1 = false;
  if (((char)iVar2 != '\0') && (this->_s != -1)) {
    if (this->_inbuf == (char *)0x0) {
      SetBufsizeIn(this,0x1000);
    }
    buf = (uchar *)this->_writeptr;
    uVar3 = _readBytes(this,buf,(ulong)this->_writeSize);
    iVar2 = (int)buf;
    if ((int)uVar3 < 1) {
      if ((uVar3 == 0xffffffff) && (iVar4 = _GetError(), iVar4 == 0xb)) {
        return false;
      }
      close(this,iVar2);
    }
    else {
      this->_inbuf[uVar3] = '\0';
      this->_recvSize = uVar3;
      this->_writeSize = this->_inbufSize - 1;
      this->_writeptr = this->_inbuf;
      this->_readptr = this->_inbuf;
      (*this->_vptr_TcpSocket[4])(this);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool TcpSocket::update(void)
{
   if(!_OnUpdate())
       return false;

   if(!isOpen())
       return false;

    if(!_inbuf)
        SetBufsizeIn(DEFAULT_BUFSIZE);

    int bytes = _readBytes((unsigned char*)_writeptr, _writeSize);
    //traceprint("TcpSocket::update: _readBytes() result %d\n", bytes);
    if(bytes > 0) // we received something
    {
        _inbuf[bytes] = 0;
        _recvSize = bytes;

        // reset pointers for next read
        _writeSize = _inbufSize - 1;
        _readptr = _writeptr = _inbuf;

        _OnData();
    }
    else if(bytes == 0) // remote has closed the connection
    {
        close();
    }
    else // whoops, error?
    {
        // Possible that the error is returned directly (in that case, < -1, or -1 is returned and the error has to be retrieved seperately.
        // But in the latter case, error numbers may be positive (at least on windows...)
        int err = bytes == -1 ? _GetError() : bytes;
        switch(err)
        {
        case EWOULDBLOCK:
#if defined(EAGAIN) && (EWOULDBLOCK != EAGAIN)
        case EAGAIN: // linux man pages say this can also happen instead of EWOULDBLOCK
#endif
            return false;

#ifdef MINIHTTP_USE_MBEDTLS
        case MBEDTLS_ERR_SSL_WANT_READ:
            break; // Try again later
#endif

        default:
            traceprint("SOCKET UPDATE ERROR: (%d): %s\n", err, _GetErrorStr(err).c_str());
        case ECONNRESET:
        case ENOTCONN:
        case ETIMEDOUT:
#ifdef _WIN32
        case WSAECONNABORTED:
        case WSAESHUTDOWN:
#endif
            close();
            break;
        }
    }
    return true;
}